

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::neverReturn(TestMoreStuffImpl *this,NeverReturnContext context)

{
  Promise<void> *pPVar1;
  Reader local_118;
  Client local_e8;
  Maybe<capnp::MessageSize> local_c8;
  Builder local_b0;
  Reader local_78;
  Client local_48;
  undefined1 local_30 [16];
  Promise<void> promise;
  TestMoreStuffImpl *this_local;
  NeverReturnContext context_local;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)context.hook;
  context_local.hook = (CallContextHook *)this;
  kj::_::NeverDone::operator_cast_to_Promise((NeverDone *)local_30);
  CallContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,_capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
  ::getParams(&local_78,
              (CallContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,_capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
               *)&this_local);
  capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams::Reader::getCap(&local_48,&local_78)
  ;
  kj::Promise<void>::attach<capnproto_test::capnp::test::TestInterface::Client>
            ((Promise<void> *)(local_30 + 8),(Client *)local_30);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_48);
  kj::Promise<void>::~Promise((Promise<void> *)local_30);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_c8);
  CallContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,_capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
  ::getResults(&local_b0,
               (CallContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,_capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
                *)&this_local,&local_c8);
  CallContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,_capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
  ::getParams(&local_118,
              (CallContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,_capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
               *)&this_local);
  capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams::Reader::getCap
            (&local_e8,&local_118);
  capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults::Builder::setCapCopy
            (&local_b0,&local_e8);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_e8);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_c8);
  pPVar1 = kj::mv<kj::Promise<void>>((Promise<void> *)(local_30 + 8));
  kj::Promise<void>::Promise((Promise<void> *)this,pPVar1);
  kj::Promise<void>::~Promise((Promise<void> *)(local_30 + 8));
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::neverReturn(NeverReturnContext context) {
  ++callCount;

  // Attach `cap` to the promise to make sure it is released.
  auto promise = kj::Promise<void>(kj::NEVER_DONE).attach(context.getParams().getCap());

  // Also attach `cap` to the result struct to make sure that is released.
  context.getResults().setCapCopy(context.getParams().getCap());

  return kj::mv(promise);
}